

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O0

void sd_add_seq(kseq_t *seq,int file,int use_header)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  void *pvVar5;
  char *pcVar6;
  UT_hash_handle *pUVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  sd_lookup_t *psVar13;
  char *pcVar14;
  UT_hash_table *pUVar15;
  UT_hash_bucket *pUVar16;
  UT_hash_bucket *pUVar17;
  uint local_16c;
  uint local_15c;
  UT_hash_bucket *_he_newbkt_1;
  UT_hash_bucket *_he_new_buckets_1;
  UT_hash_handle *_he_hh_nxt_1;
  UT_hash_handle *_he_thh_1;
  uint _he_bkt_i_1;
  uint _he_bkt_1;
  uchar *_hj_key_3;
  uint _hj_k_3;
  uint _hj_j_3;
  uint _hj_i_3;
  uint _ha_bkt_1;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  uchar *_hj_key_2;
  uint _hj_k_2;
  uint _hj_j_2;
  uint _hj_i_2;
  uint _ha_bkt;
  uchar *_hj_key_1;
  uint local_50;
  uint _hj_k_1;
  uint _hj_j_1;
  uint _hj_i_1;
  uint _hf_hashv_1;
  uint _hf_bkt_1;
  uchar *_hj_key;
  uint local_30;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _hf_bkt;
  sd_lookup_t *s;
  int use_header_local;
  int file_local;
  kseq_t *seq_local;
  
  if (use_header == 0) {
    __hf_hashv = 0;
    if (sd_lookup != (sd_lookup_t *)0x0) {
      __hj_i_2 = (byte *)(seq->seq).s;
      _hj_j_1 = 0xfeedbeef;
      local_50 = 0x9e3779b9;
      _hj_k_1 = 0x9e3779b9;
      sVar12 = strlen((seq->seq).s);
      for (_hj_key_1._4_4_ = (uint)sVar12; 0xb < _hj_key_1._4_4_;
          _hj_key_1._4_4_ = _hj_key_1._4_4_ - 0xc) {
        iVar8 = (uint)__hj_i_2[4] + (uint)__hj_i_2[5] * 0x100 + (uint)__hj_i_2[6] * 0x10000 +
                (uint)__hj_i_2[7] * 0x1000000 + local_50;
        uVar9 = (uint)__hj_i_2[8] + (uint)__hj_i_2[9] * 0x100 + (uint)__hj_i_2[10] * 0x10000 +
                (uint)__hj_i_2[0xb] * 0x1000000 + _hj_j_1;
        uVar10 = uVar9 >> 0xd ^
                 (((uint)*__hj_i_2 + (uint)__hj_i_2[1] * 0x100 + (uint)__hj_i_2[2] * 0x10000 +
                   (uint)__hj_i_2[3] * 0x1000000 + _hj_k_1) - iVar8) - uVar9;
        uVar11 = uVar10 << 8 ^ (iVar8 - uVar9) - uVar10;
        uVar9 = uVar11 >> 0xd ^ (uVar9 - uVar10) - uVar11;
        uVar10 = uVar9 >> 0xc ^ (uVar10 - uVar11) - uVar9;
        uVar11 = uVar10 << 0x10 ^ (uVar11 - uVar9) - uVar10;
        uVar9 = uVar11 >> 5 ^ (uVar9 - uVar10) - uVar11;
        _hj_k_1 = uVar9 >> 3 ^ (uVar10 - uVar11) - uVar9;
        local_50 = _hj_k_1 << 10 ^ (uVar11 - uVar9) - _hj_k_1;
        _hj_j_1 = local_50 >> 0xf ^ (uVar9 - _hj_k_1) - local_50;
        __hj_i_2 = __hj_i_2 + 0xc;
      }
      sVar12 = strlen((seq->seq).s);
      _hj_j_1 = _hj_j_1 + (int)sVar12;
      switch(_hj_key_1._4_4_) {
      case 0xb:
        _hj_j_1 = (uint)__hj_i_2[10] * 0x1000000 + _hj_j_1;
      case 10:
        _hj_j_1 = (uint)__hj_i_2[9] * 0x10000 + _hj_j_1;
      case 9:
        _hj_j_1 = (uint)__hj_i_2[8] * 0x100 + _hj_j_1;
      case 8:
        local_50 = (uint)__hj_i_2[7] * 0x1000000 + local_50;
      case 7:
        local_50 = (uint)__hj_i_2[6] * 0x10000 + local_50;
      case 6:
        local_50 = (uint)__hj_i_2[5] * 0x100 + local_50;
      case 5:
        local_50 = __hj_i_2[4] + local_50;
      case 4:
        _hj_k_1 = (uint)__hj_i_2[3] * 0x1000000 + _hj_k_1;
      case 3:
        _hj_k_1 = (uint)__hj_i_2[2] * 0x10000 + _hj_k_1;
      case 2:
        _hj_k_1 = (uint)__hj_i_2[1] * 0x100 + _hj_k_1;
      case 1:
        _hj_k_1 = *__hj_i_2 + _hj_k_1;
      default:
        uVar9 = _hj_j_1 >> 0xd ^ (_hj_k_1 - local_50) - _hj_j_1;
        uVar10 = uVar9 << 8 ^ (local_50 - _hj_j_1) - uVar9;
        uVar11 = uVar10 >> 0xd ^ (_hj_j_1 - uVar9) - uVar10;
        uVar9 = uVar11 >> 0xc ^ (uVar9 - uVar10) - uVar11;
        uVar10 = uVar9 << 0x10 ^ (uVar10 - uVar11) - uVar9;
        uVar11 = uVar10 >> 5 ^ (uVar11 - uVar9) - uVar10;
        uVar9 = uVar11 >> 3 ^ (uVar9 - uVar10) - uVar11;
        uVar10 = uVar9 << 10 ^ (uVar10 - uVar11) - uVar9;
        uVar9 = (uVar10 >> 0xf ^ (uVar11 - uVar9) - uVar10) & ((sd_lookup->hh).tbl)->num_buckets - 1
        ;
        if (((sd_lookup->hh).tbl)->buckets[uVar9].hh_head == (UT_hash_handle *)0x0) {
          __hf_hashv = 0;
        }
        else {
          __hf_hashv = (long)((sd_lookup->hh).tbl)->buckets[uVar9].hh_head -
                       ((sd_lookup->hh).tbl)->hho;
        }
      }
      while (__hf_hashv != 0) {
        uVar9 = *(uint *)(__hf_hashv + 0x58);
        sVar12 = strlen((seq->seq).s);
        if (uVar9 == sVar12) {
          pvVar5 = *(void **)(__hf_hashv + 0x50);
          pcVar14 = (seq->seq).s;
          sVar12 = strlen((seq->seq).s);
          iVar8 = memcmp(pvVar5,pcVar14,sVar12);
          if (iVar8 == 0) break;
        }
        if (*(long *)(__hf_hashv + 0x48) == 0) {
          __hf_hashv = 0;
        }
        else {
          __hf_hashv = *(long *)(__hf_hashv + 0x48) - ((sd_lookup->hh).tbl)->hho;
        }
      }
    }
  }
  else {
    __hf_hashv = 0;
    if (sd_lookup != (sd_lookup_t *)0x0) {
      __hf_hashv_1 = (byte *)(seq->name).s;
      _hj_j = 0xfeedbeef;
      local_30 = 0x9e3779b9;
      _hj_k = 0x9e3779b9;
      sVar12 = strlen((seq->name).s);
      for (_hj_key._4_4_ = (uint)sVar12; 0xb < _hj_key._4_4_; _hj_key._4_4_ = _hj_key._4_4_ - 0xc) {
        iVar8 = (uint)__hf_hashv_1[4] + (uint)__hf_hashv_1[5] * 0x100 +
                (uint)__hf_hashv_1[6] * 0x10000 + (uint)__hf_hashv_1[7] * 0x1000000 + local_30;
        uVar9 = (uint)__hf_hashv_1[8] + (uint)__hf_hashv_1[9] * 0x100 +
                (uint)__hf_hashv_1[10] * 0x10000 + (uint)__hf_hashv_1[0xb] * 0x1000000 + _hj_j;
        uVar10 = uVar9 >> 0xd ^
                 (((uint)*__hf_hashv_1 + (uint)__hf_hashv_1[1] * 0x100 +
                   (uint)__hf_hashv_1[2] * 0x10000 + (uint)__hf_hashv_1[3] * 0x1000000 + _hj_k) -
                 iVar8) - uVar9;
        uVar11 = uVar10 << 8 ^ (iVar8 - uVar9) - uVar10;
        uVar9 = uVar11 >> 0xd ^ (uVar9 - uVar10) - uVar11;
        uVar10 = uVar9 >> 0xc ^ (uVar10 - uVar11) - uVar9;
        uVar11 = uVar10 << 0x10 ^ (uVar11 - uVar9) - uVar10;
        uVar9 = uVar11 >> 5 ^ (uVar9 - uVar10) - uVar11;
        _hj_k = uVar9 >> 3 ^ (uVar10 - uVar11) - uVar9;
        local_30 = _hj_k << 10 ^ (uVar11 - uVar9) - _hj_k;
        _hj_j = local_30 >> 0xf ^ (uVar9 - _hj_k) - local_30;
        __hf_hashv_1 = __hf_hashv_1 + 0xc;
      }
      sVar12 = strlen((seq->name).s);
      _hj_j = _hj_j + (int)sVar12;
      switch(_hj_key._4_4_) {
      case 0xb:
        _hj_j = (uint)__hf_hashv_1[10] * 0x1000000 + _hj_j;
      case 10:
        _hj_j = (uint)__hf_hashv_1[9] * 0x10000 + _hj_j;
      case 9:
        _hj_j = (uint)__hf_hashv_1[8] * 0x100 + _hj_j;
      case 8:
        local_30 = (uint)__hf_hashv_1[7] * 0x1000000 + local_30;
      case 7:
        local_30 = (uint)__hf_hashv_1[6] * 0x10000 + local_30;
      case 6:
        local_30 = (uint)__hf_hashv_1[5] * 0x100 + local_30;
      case 5:
        local_30 = __hf_hashv_1[4] + local_30;
      case 4:
        _hj_k = (uint)__hf_hashv_1[3] * 0x1000000 + _hj_k;
      case 3:
        _hj_k = (uint)__hf_hashv_1[2] * 0x10000 + _hj_k;
      case 2:
        _hj_k = (uint)__hf_hashv_1[1] * 0x100 + _hj_k;
      case 1:
        _hj_k = *__hf_hashv_1 + _hj_k;
      default:
        uVar9 = _hj_j >> 0xd ^ (_hj_k - local_30) - _hj_j;
        uVar10 = uVar9 << 8 ^ (local_30 - _hj_j) - uVar9;
        uVar11 = uVar10 >> 0xd ^ (_hj_j - uVar9) - uVar10;
        uVar9 = uVar11 >> 0xc ^ (uVar9 - uVar10) - uVar11;
        uVar10 = uVar9 << 0x10 ^ (uVar10 - uVar11) - uVar9;
        uVar11 = uVar10 >> 5 ^ (uVar11 - uVar9) - uVar10;
        uVar9 = uVar11 >> 3 ^ (uVar9 - uVar10) - uVar11;
        uVar10 = uVar9 << 10 ^ (uVar10 - uVar11) - uVar9;
        uVar9 = (uVar10 >> 0xf ^ (uVar11 - uVar9) - uVar10) & ((sd_lookup->hh).tbl)->num_buckets - 1
        ;
        if (((sd_lookup->hh).tbl)->buckets[uVar9].hh_head == (UT_hash_handle *)0x0) {
          __hf_hashv = 0;
        }
        else {
          __hf_hashv = (long)((sd_lookup->hh).tbl)->buckets[uVar9].hh_head -
                       ((sd_lookup->hh).tbl)->hho;
        }
      }
      while (__hf_hashv != 0) {
        uVar9 = *(uint *)(__hf_hashv + 0x58);
        sVar12 = strlen((seq->name).s);
        if (uVar9 == sVar12) {
          pvVar5 = *(void **)(__hf_hashv + 0x50);
          pcVar14 = (seq->name).s;
          sVar12 = strlen((seq->name).s);
          iVar8 = memcmp(pvVar5,pcVar14,sVar12);
          if (iVar8 == 0) break;
        }
        if (*(long *)(__hf_hashv + 0x48) == 0) {
          __hf_hashv = 0;
        }
        else {
          __hf_hashv = *(long *)(__hf_hashv + 0x48) - ((sd_lookup->hh).tbl)->hho;
        }
      }
    }
  }
  if (__hf_hashv == 0) {
    psVar13 = (sd_lookup_t *)malloc(0x60);
    if (psVar13 == (sd_lookup_t *)0x0) {
      fprintf(_stderr,"couldn\'t get memory for sd_lookup_t\n");
      exit(1);
    }
    psVar13->seq = (char *)0x0;
    psVar13->name = (char *)0x0;
    psVar13->count = 1;
    psVar13->in_a = 0;
    psVar13->in_b = 0;
    sVar12 = strlen((seq->seq).s);
    pcVar14 = (char *)malloc((sVar12 + 1) * 8);
    psVar13->seq = pcVar14;
    if (psVar13->seq == (char *)0x0) {
      fprintf(_stderr,"couldn\'t get memory for seq string\n");
      exit(1);
    }
    pcVar14 = psVar13->seq;
    pcVar6 = (seq->seq).s;
    sVar12 = strlen((seq->seq).s);
    strncpy(pcVar14,pcVar6,sVar12 + 1);
    sVar12 = strlen((seq->name).s);
    pcVar14 = (char *)malloc((sVar12 + 1) * 8);
    psVar13->name = pcVar14;
    if (psVar13->name == (char *)0x0) {
      fprintf(_stderr,"couldn\'t get memory for name string\n");
      exit(1);
    }
    pcVar14 = psVar13->name;
    pcVar6 = (seq->name).s;
    sVar12 = strlen((seq->name).s);
    strncpy(pcVar14,pcVar6,sVar12 + 1);
    if ((seq->comment).s == (char *)0x0) {
      psVar13->comment = (char *)0x0;
    }
    else {
      sVar12 = strlen((seq->comment).s);
      pcVar14 = (char *)malloc((sVar12 + 1) * 8);
      psVar13->comment = pcVar14;
      if (psVar13->comment == (char *)0x0) {
        fprintf(_stderr,"couldn\'t get memory for comment string\n");
        exit(1);
      }
      pcVar14 = psVar13->comment;
      pcVar6 = (seq->comment).s;
      sVar12 = strlen((seq->comment).s);
      strncpy(pcVar14,pcVar6,sVar12 + 1);
    }
    if (file == 1) {
      psVar13->in_a = 1;
    }
    else if (file == 2) {
      psVar13->in_b = 1;
    }
    if (use_header == 0) {
      (psVar13->hh).next = (void *)0x0;
      (psVar13->hh).key = psVar13->seq;
      sVar12 = strlen(psVar13->seq);
      (psVar13->hh).keylen = (uint)sVar12;
      if (sd_lookup == (sd_lookup_t *)0x0) {
        sd_lookup = psVar13;
        (psVar13->hh).prev = (void *)0x0;
        pUVar15 = (UT_hash_table *)malloc(0x40);
        (sd_lookup->hh).tbl = pUVar15;
        if ((sd_lookup->hh).tbl == (UT_hash_table *)0x0) {
          exit(-1);
        }
        memset((sd_lookup->hh).tbl,0,0x40);
        ((sd_lookup->hh).tbl)->tail = &sd_lookup->hh;
        ((sd_lookup->hh).tbl)->num_buckets = 0x20;
        ((sd_lookup->hh).tbl)->log2_num_buckets = 5;
        ((sd_lookup->hh).tbl)->hho = 0x28;
        pUVar16 = (UT_hash_bucket *)malloc(0x200);
        ((sd_lookup->hh).tbl)->buckets = pUVar16;
        if (((sd_lookup->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
          exit(-1);
        }
        memset(((sd_lookup->hh).tbl)->buckets,0,0x200);
        ((sd_lookup->hh).tbl)->signature = 0xa0111fe1;
      }
      else {
        ((sd_lookup->hh).tbl)->tail->next = psVar13;
        (psVar13->hh).prev =
             (void *)((long)((sd_lookup->hh).tbl)->tail - ((sd_lookup->hh).tbl)->hho);
        ((sd_lookup->hh).tbl)->tail = &psVar13->hh;
      }
      pUVar15 = (sd_lookup->hh).tbl;
      pUVar15->num_items = pUVar15->num_items + 1;
      (psVar13->hh).tbl = (sd_lookup->hh).tbl;
      __he_bkt_i_1 = (byte *)psVar13->seq;
      (psVar13->hh).hashv = 0xfeedbeef;
      _hj_key_3._4_4_ = 0x9e3779b9;
      _hj_k_3 = 0x9e3779b9;
      sVar12 = strlen(psVar13->seq);
      for (_hj_key_3._0_4_ = (uint)sVar12; 0xb < (uint)_hj_key_3;
          _hj_key_3._0_4_ = (uint)_hj_key_3 - 0xc) {
        bVar1 = *__he_bkt_i_1;
        bVar2 = __he_bkt_i_1[1];
        bVar3 = __he_bkt_i_1[2];
        bVar4 = __he_bkt_i_1[3];
        iVar8 = (uint)__he_bkt_i_1[4] + (uint)__he_bkt_i_1[5] * 0x100 +
                (uint)__he_bkt_i_1[6] * 0x10000 + (uint)__he_bkt_i_1[7] * 0x1000000 +
                _hj_key_3._4_4_;
        (psVar13->hh).hashv =
             (uint)__he_bkt_i_1[8] + (uint)__he_bkt_i_1[9] * 0x100 +
             (uint)__he_bkt_i_1[10] * 0x10000 + (uint)__he_bkt_i_1[0xb] * 0x1000000 +
             (psVar13->hh).hashv;
        uVar9 = (psVar13->hh).hashv >> 0xd ^
                (((uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 +
                  (uint)bVar4 * 0x1000000 + _hj_k_3) - iVar8) - (psVar13->hh).hashv;
        uVar10 = uVar9 << 8 ^ (iVar8 - (psVar13->hh).hashv) - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
        (psVar13->hh).hashv = uVar10 >> 0xd ^ (psVar13->hh).hashv;
        uVar9 = (psVar13->hh).hashv >> 0xc ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
        uVar10 = uVar9 << 0x10 ^ (uVar10 - (psVar13->hh).hashv) - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
        (psVar13->hh).hashv = uVar10 >> 5 ^ (psVar13->hh).hashv;
        _hj_k_3 = (psVar13->hh).hashv >> 3 ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
        _hj_key_3._4_4_ = _hj_k_3 << 10 ^ (uVar10 - (psVar13->hh).hashv) - _hj_k_3;
        (psVar13->hh).hashv = (psVar13->hh).hashv - _hj_k_3;
        (psVar13->hh).hashv = (psVar13->hh).hashv - _hj_key_3._4_4_;
        (psVar13->hh).hashv = _hj_key_3._4_4_ >> 0xf ^ (psVar13->hh).hashv;
        __he_bkt_i_1 = __he_bkt_i_1 + 0xc;
      }
      sVar12 = strlen(psVar13->seq);
      (psVar13->hh).hashv = (psVar13->hh).hashv + (int)sVar12;
      switch((uint)_hj_key_3) {
      case 0xb:
        (psVar13->hh).hashv = (uint)__he_bkt_i_1[10] * 0x1000000 + (psVar13->hh).hashv;
      case 10:
        (psVar13->hh).hashv = (uint)__he_bkt_i_1[9] * 0x10000 + (psVar13->hh).hashv;
      case 9:
        (psVar13->hh).hashv = (uint)__he_bkt_i_1[8] * 0x100 + (psVar13->hh).hashv;
      case 8:
        _hj_key_3._4_4_ = (uint)__he_bkt_i_1[7] * 0x1000000 + _hj_key_3._4_4_;
      case 7:
        _hj_key_3._4_4_ = (uint)__he_bkt_i_1[6] * 0x10000 + _hj_key_3._4_4_;
      case 6:
        _hj_key_3._4_4_ = (uint)__he_bkt_i_1[5] * 0x100 + _hj_key_3._4_4_;
      case 5:
        _hj_key_3._4_4_ = __he_bkt_i_1[4] + _hj_key_3._4_4_;
      case 4:
        _hj_k_3 = (uint)__he_bkt_i_1[3] * 0x1000000 + _hj_k_3;
      case 3:
        _hj_k_3 = (uint)__he_bkt_i_1[2] * 0x10000 + _hj_k_3;
      case 2:
        _hj_k_3 = (uint)__he_bkt_i_1[1] * 0x100 + _hj_k_3;
      case 1:
        _hj_k_3 = *__he_bkt_i_1 + _hj_k_3;
      }
      uVar9 = (psVar13->hh).hashv >> 0xd ^ (_hj_k_3 - _hj_key_3._4_4_) - (psVar13->hh).hashv;
      uVar10 = uVar9 << 8 ^ (_hj_key_3._4_4_ - (psVar13->hh).hashv) - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
      (psVar13->hh).hashv = uVar10 >> 0xd ^ (psVar13->hh).hashv;
      uVar9 = (psVar13->hh).hashv >> 0xc ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
      uVar10 = uVar9 << 0x10 ^ (uVar10 - (psVar13->hh).hashv) - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
      (psVar13->hh).hashv = uVar10 >> 5 ^ (psVar13->hh).hashv;
      uVar9 = (psVar13->hh).hashv >> 3 ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
      uVar10 = uVar9 << 10 ^ (uVar10 - (psVar13->hh).hashv) - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
      (psVar13->hh).hashv = uVar10 >> 0xf ^ (psVar13->hh).hashv;
      uVar9 = (psVar13->hh).hashv & ((sd_lookup->hh).tbl)->num_buckets - 1;
      pUVar16 = ((sd_lookup->hh).tbl)->buckets;
      pUVar16[uVar9].count = pUVar16[uVar9].count + 1;
      (psVar13->hh).hh_next = ((sd_lookup->hh).tbl)->buckets[uVar9].hh_head;
      (psVar13->hh).hh_prev = (UT_hash_handle *)0x0;
      if (((sd_lookup->hh).tbl)->buckets[uVar9].hh_head != (UT_hash_handle *)0x0) {
        (((sd_lookup->hh).tbl)->buckets[uVar9].hh_head)->hh_prev = &psVar13->hh;
      }
      ((sd_lookup->hh).tbl)->buckets[uVar9].hh_head = &psVar13->hh;
      if (((((sd_lookup->hh).tbl)->buckets[uVar9].expand_mult + 1) * 10 <=
           ((sd_lookup->hh).tbl)->buckets[uVar9].count) && (((psVar13->hh).tbl)->noexpand != 1)) {
        pUVar16 = (UT_hash_bucket *)malloc((ulong)(((psVar13->hh).tbl)->num_buckets << 1) << 4);
        if (pUVar16 == (UT_hash_bucket *)0x0) {
          exit(-1);
        }
        memset(pUVar16,0,(ulong)(((psVar13->hh).tbl)->num_buckets << 1) << 4);
        ((psVar13->hh).tbl)->ideal_chain_maxlen =
             (((psVar13->hh).tbl)->num_items >>
             ((char)((psVar13->hh).tbl)->log2_num_buckets + 1U & 0x1f)) +
             (uint)((((psVar13->hh).tbl)->num_items & ((psVar13->hh).tbl)->num_buckets * 2 - 1) != 0
                   );
        ((psVar13->hh).tbl)->nonideal_items = 0;
        for (_he_thh_1._0_4_ = 0; (uint)_he_thh_1 < ((psVar13->hh).tbl)->num_buckets;
            _he_thh_1._0_4_ = (uint)_he_thh_1 + 1) {
          _he_hh_nxt_1 = ((psVar13->hh).tbl)->buckets[(uint)_he_thh_1].hh_head;
          while (_he_hh_nxt_1 != (UT_hash_handle *)0x0) {
            pUVar7 = _he_hh_nxt_1->hh_next;
            pUVar17 = pUVar16 + (_he_hh_nxt_1->hashv & ((psVar13->hh).tbl)->num_buckets * 2 - 1);
            uVar9 = pUVar17->count + 1;
            pUVar17->count = uVar9;
            if (((psVar13->hh).tbl)->ideal_chain_maxlen < uVar9) {
              pUVar15 = (psVar13->hh).tbl;
              pUVar15->nonideal_items = pUVar15->nonideal_items + 1;
              pUVar17->expand_mult = pUVar17->count / ((psVar13->hh).tbl)->ideal_chain_maxlen;
            }
            _he_hh_nxt_1->hh_prev = (UT_hash_handle *)0x0;
            _he_hh_nxt_1->hh_next = pUVar17->hh_head;
            if (pUVar17->hh_head != (UT_hash_handle *)0x0) {
              pUVar17->hh_head->hh_prev = _he_hh_nxt_1;
            }
            pUVar17->hh_head = _he_hh_nxt_1;
            _he_hh_nxt_1 = pUVar7;
          }
        }
        free(((psVar13->hh).tbl)->buckets);
        pUVar15 = (psVar13->hh).tbl;
        pUVar15->num_buckets = pUVar15->num_buckets << 1;
        pUVar15 = (psVar13->hh).tbl;
        pUVar15->log2_num_buckets = pUVar15->log2_num_buckets + 1;
        ((psVar13->hh).tbl)->buckets = pUVar16;
        if (((psVar13->hh).tbl)->num_items >> 1 < ((psVar13->hh).tbl)->nonideal_items) {
          local_16c = ((psVar13->hh).tbl)->ineff_expands + 1;
        }
        else {
          local_16c = 0;
        }
        ((psVar13->hh).tbl)->ineff_expands = local_16c;
        if (1 < ((psVar13->hh).tbl)->ineff_expands) {
          ((psVar13->hh).tbl)->noexpand = 1;
        }
      }
    }
    else {
      (psVar13->hh).next = (void *)0x0;
      (psVar13->hh).key = psVar13->name;
      sVar12 = strlen(psVar13->name);
      (psVar13->hh).keylen = (uint)sVar12;
      if (sd_lookup == (sd_lookup_t *)0x0) {
        sd_lookup = psVar13;
        (psVar13->hh).prev = (void *)0x0;
        pUVar15 = (UT_hash_table *)malloc(0x40);
        (sd_lookup->hh).tbl = pUVar15;
        if ((sd_lookup->hh).tbl == (UT_hash_table *)0x0) {
          exit(-1);
        }
        memset((sd_lookup->hh).tbl,0,0x40);
        ((sd_lookup->hh).tbl)->tail = &sd_lookup->hh;
        ((sd_lookup->hh).tbl)->num_buckets = 0x20;
        ((sd_lookup->hh).tbl)->log2_num_buckets = 5;
        ((sd_lookup->hh).tbl)->hho = 0x28;
        pUVar16 = (UT_hash_bucket *)malloc(0x200);
        ((sd_lookup->hh).tbl)->buckets = pUVar16;
        if (((sd_lookup->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
          exit(-1);
        }
        memset(((sd_lookup->hh).tbl)->buckets,0,0x200);
        ((sd_lookup->hh).tbl)->signature = 0xa0111fe1;
      }
      else {
        ((sd_lookup->hh).tbl)->tail->next = psVar13;
        (psVar13->hh).prev =
             (void *)((long)((sd_lookup->hh).tbl)->tail - ((sd_lookup->hh).tbl)->hho);
        ((sd_lookup->hh).tbl)->tail = &psVar13->hh;
      }
      pUVar15 = (sd_lookup->hh).tbl;
      pUVar15->num_items = pUVar15->num_items + 1;
      (psVar13->hh).tbl = (sd_lookup->hh).tbl;
      __he_bkt_i = (byte *)psVar13->name;
      (psVar13->hh).hashv = 0xfeedbeef;
      _hj_key_2._4_4_ = 0x9e3779b9;
      _hj_k_2 = 0x9e3779b9;
      sVar12 = strlen(psVar13->name);
      for (_hj_key_2._0_4_ = (uint)sVar12; 0xb < (uint)_hj_key_2;
          _hj_key_2._0_4_ = (uint)_hj_key_2 - 0xc) {
        bVar1 = *__he_bkt_i;
        bVar2 = __he_bkt_i[1];
        bVar3 = __he_bkt_i[2];
        bVar4 = __he_bkt_i[3];
        iVar8 = (uint)__he_bkt_i[4] + (uint)__he_bkt_i[5] * 0x100 + (uint)__he_bkt_i[6] * 0x10000 +
                (uint)__he_bkt_i[7] * 0x1000000 + _hj_key_2._4_4_;
        (psVar13->hh).hashv =
             (uint)__he_bkt_i[8] + (uint)__he_bkt_i[9] * 0x100 + (uint)__he_bkt_i[10] * 0x10000 +
             (uint)__he_bkt_i[0xb] * 0x1000000 + (psVar13->hh).hashv;
        uVar9 = (psVar13->hh).hashv >> 0xd ^
                (((uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 +
                  (uint)bVar4 * 0x1000000 + _hj_k_2) - iVar8) - (psVar13->hh).hashv;
        uVar10 = uVar9 << 8 ^ (iVar8 - (psVar13->hh).hashv) - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
        (psVar13->hh).hashv = uVar10 >> 0xd ^ (psVar13->hh).hashv;
        uVar9 = (psVar13->hh).hashv >> 0xc ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
        uVar10 = uVar9 << 0x10 ^ (uVar10 - (psVar13->hh).hashv) - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
        (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
        (psVar13->hh).hashv = uVar10 >> 5 ^ (psVar13->hh).hashv;
        _hj_k_2 = (psVar13->hh).hashv >> 3 ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
        _hj_key_2._4_4_ = _hj_k_2 << 10 ^ (uVar10 - (psVar13->hh).hashv) - _hj_k_2;
        (psVar13->hh).hashv = (psVar13->hh).hashv - _hj_k_2;
        (psVar13->hh).hashv = (psVar13->hh).hashv - _hj_key_2._4_4_;
        (psVar13->hh).hashv = _hj_key_2._4_4_ >> 0xf ^ (psVar13->hh).hashv;
        __he_bkt_i = __he_bkt_i + 0xc;
      }
      sVar12 = strlen(psVar13->name);
      (psVar13->hh).hashv = (psVar13->hh).hashv + (int)sVar12;
      switch((uint)_hj_key_2) {
      case 0xb:
        (psVar13->hh).hashv = (uint)__he_bkt_i[10] * 0x1000000 + (psVar13->hh).hashv;
      case 10:
        (psVar13->hh).hashv = (uint)__he_bkt_i[9] * 0x10000 + (psVar13->hh).hashv;
      case 9:
        (psVar13->hh).hashv = (uint)__he_bkt_i[8] * 0x100 + (psVar13->hh).hashv;
      case 8:
        _hj_key_2._4_4_ = (uint)__he_bkt_i[7] * 0x1000000 + _hj_key_2._4_4_;
      case 7:
        _hj_key_2._4_4_ = (uint)__he_bkt_i[6] * 0x10000 + _hj_key_2._4_4_;
      case 6:
        _hj_key_2._4_4_ = (uint)__he_bkt_i[5] * 0x100 + _hj_key_2._4_4_;
      case 5:
        _hj_key_2._4_4_ = __he_bkt_i[4] + _hj_key_2._4_4_;
      case 4:
        _hj_k_2 = (uint)__he_bkt_i[3] * 0x1000000 + _hj_k_2;
      case 3:
        _hj_k_2 = (uint)__he_bkt_i[2] * 0x10000 + _hj_k_2;
      case 2:
        _hj_k_2 = (uint)__he_bkt_i[1] * 0x100 + _hj_k_2;
      case 1:
        _hj_k_2 = *__he_bkt_i + _hj_k_2;
      }
      uVar9 = (psVar13->hh).hashv >> 0xd ^ (_hj_k_2 - _hj_key_2._4_4_) - (psVar13->hh).hashv;
      uVar10 = uVar9 << 8 ^ (_hj_key_2._4_4_ - (psVar13->hh).hashv) - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
      (psVar13->hh).hashv = uVar10 >> 0xd ^ (psVar13->hh).hashv;
      uVar9 = (psVar13->hh).hashv >> 0xc ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
      uVar10 = uVar9 << 0x10 ^ (uVar10 - (psVar13->hh).hashv) - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
      (psVar13->hh).hashv = uVar10 >> 5 ^ (psVar13->hh).hashv;
      uVar9 = (psVar13->hh).hashv >> 3 ^ (uVar9 - uVar10) - (psVar13->hh).hashv;
      uVar10 = uVar9 << 10 ^ (uVar10 - (psVar13->hh).hashv) - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar9;
      (psVar13->hh).hashv = (psVar13->hh).hashv - uVar10;
      (psVar13->hh).hashv = uVar10 >> 0xf ^ (psVar13->hh).hashv;
      uVar9 = (psVar13->hh).hashv & ((sd_lookup->hh).tbl)->num_buckets - 1;
      pUVar16 = ((sd_lookup->hh).tbl)->buckets;
      pUVar16[uVar9].count = pUVar16[uVar9].count + 1;
      (psVar13->hh).hh_next = ((sd_lookup->hh).tbl)->buckets[uVar9].hh_head;
      (psVar13->hh).hh_prev = (UT_hash_handle *)0x0;
      if (((sd_lookup->hh).tbl)->buckets[uVar9].hh_head != (UT_hash_handle *)0x0) {
        (((sd_lookup->hh).tbl)->buckets[uVar9].hh_head)->hh_prev = &psVar13->hh;
      }
      ((sd_lookup->hh).tbl)->buckets[uVar9].hh_head = &psVar13->hh;
      if (((((sd_lookup->hh).tbl)->buckets[uVar9].expand_mult + 1) * 10 <=
           ((sd_lookup->hh).tbl)->buckets[uVar9].count) && (((psVar13->hh).tbl)->noexpand != 1)) {
        pUVar16 = (UT_hash_bucket *)malloc((ulong)(((psVar13->hh).tbl)->num_buckets << 1) << 4);
        if (pUVar16 == (UT_hash_bucket *)0x0) {
          exit(-1);
        }
        memset(pUVar16,0,(ulong)(((psVar13->hh).tbl)->num_buckets << 1) << 4);
        ((psVar13->hh).tbl)->ideal_chain_maxlen =
             (((psVar13->hh).tbl)->num_items >>
             ((char)((psVar13->hh).tbl)->log2_num_buckets + 1U & 0x1f)) +
             (uint)((((psVar13->hh).tbl)->num_items & ((psVar13->hh).tbl)->num_buckets * 2 - 1) != 0
                   );
        ((psVar13->hh).tbl)->nonideal_items = 0;
        for (_he_thh._0_4_ = 0; (uint)_he_thh < ((psVar13->hh).tbl)->num_buckets;
            _he_thh._0_4_ = (uint)_he_thh + 1) {
          _he_hh_nxt = ((psVar13->hh).tbl)->buckets[(uint)_he_thh].hh_head;
          while (_he_hh_nxt != (UT_hash_handle *)0x0) {
            pUVar7 = _he_hh_nxt->hh_next;
            pUVar17 = pUVar16 + (_he_hh_nxt->hashv & ((psVar13->hh).tbl)->num_buckets * 2 - 1);
            uVar9 = pUVar17->count + 1;
            pUVar17->count = uVar9;
            if (((psVar13->hh).tbl)->ideal_chain_maxlen < uVar9) {
              pUVar15 = (psVar13->hh).tbl;
              pUVar15->nonideal_items = pUVar15->nonideal_items + 1;
              pUVar17->expand_mult = pUVar17->count / ((psVar13->hh).tbl)->ideal_chain_maxlen;
            }
            _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
            _he_hh_nxt->hh_next = pUVar17->hh_head;
            if (pUVar17->hh_head != (UT_hash_handle *)0x0) {
              pUVar17->hh_head->hh_prev = _he_hh_nxt;
            }
            pUVar17->hh_head = _he_hh_nxt;
            _he_hh_nxt = pUVar7;
          }
        }
        free(((psVar13->hh).tbl)->buckets);
        pUVar15 = (psVar13->hh).tbl;
        pUVar15->num_buckets = pUVar15->num_buckets << 1;
        pUVar15 = (psVar13->hh).tbl;
        pUVar15->log2_num_buckets = pUVar15->log2_num_buckets + 1;
        ((psVar13->hh).tbl)->buckets = pUVar16;
        if (((psVar13->hh).tbl)->num_items >> 1 < ((psVar13->hh).tbl)->nonideal_items) {
          local_15c = ((psVar13->hh).tbl)->ineff_expands + 1;
        }
        else {
          local_15c = 0;
        }
        ((psVar13->hh).tbl)->ineff_expands = local_15c;
        if (1 < ((psVar13->hh).tbl)->ineff_expands) {
          ((psVar13->hh).tbl)->noexpand = 1;
        }
      }
    }
  }
  else {
    *(int *)(__hf_hashv + 0x18) = *(int *)(__hf_hashv + 0x18) + 1;
    if (file == 1) {
      *(undefined4 *)(__hf_hashv + 0x1c) = 1;
    }
    else if (file == 2) {
      *(undefined4 *)(__hf_hashv + 0x20) = 1;
    }
  }
  return;
}

Assistant:

void sd_add_seq(kseq_t *seq, int file, int use_header)
{
	sd_lookup_t *s;

	if (use_header)
		HASH_FIND_STR(sd_lookup,seq->name.s,s);
	else
		HASH_FIND_STR(sd_lookup,seq->seq.s,s);

	if (s==NULL) { /* key is not in hash */
		s = (sd_lookup_t *)malloc(sizeof(sd_lookup_t));
		if (s == NULL) {
			fprintf(stderr,"couldn't get memory for sd_lookup_t\n");
			exit(EXIT_FAILURE);
		} else {
			/* initialize struct */
			s->seq = NULL;
			s->name = NULL;
			s->count = 1;
			s->in_a = 0;
			s->in_b = 0;
		}

		s->seq = (char *)malloc((sizeof(char*) * (strlen(seq->seq.s)+1)));
		if (s->seq == NULL) {
			fprintf(stderr,"couldn't get memory for seq string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->seq,seq->seq.s,strlen(seq->seq.s)+1);

		s->name = (char *)malloc((sizeof(char*) * (strlen(seq->name.s)+1)));
		if (s->name == NULL) {
			fprintf(stderr,"couldn't get memory for name string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->name,seq->name.s,strlen(seq->name.s)+1);

		if (seq->comment.s != NULL) {
			s->comment = (char *)malloc((sizeof(char*) * (strlen(seq->comment.s)+1)));
			if (s->comment == NULL) {
				fprintf(stderr,"couldn't get memory for comment string\n");
				exit(EXIT_FAILURE);
			} else
				strncpy(s->comment,seq->comment.s,strlen(seq->comment.s)+1);
		} else
			s->comment = NULL;

		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
		if (use_header)
			HASH_ADD_KEYPTR( hh, sd_lookup, s->name, strlen(s->name), s );
		else
			HASH_ADD_KEYPTR( hh, sd_lookup, s->seq, strlen(s->seq), s );
	} else {
		s->count++; /* key is already in the hash, just incr count */
		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
	}
}